

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

BBox3fa * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx::CurveGeometryInterface,_embree::BezierCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx::CurveGeometryInterface,_embree::BezierCurveT>
         *this,size_t i)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  uint uVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  char *pcVar6;
  size_t sVar7;
  BufferView<embree::Vec3fa> *pBVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  float fVar33;
  float fVar39;
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  float fVar47;
  float fVar54;
  float fVar55;
  float fVar56;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar57;
  float fVar58;
  float fVar61;
  float fVar62;
  float fVar63;
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  float fVar64;
  float fVar67;
  float fVar68;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar69;
  vfloat4 b0;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar82;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar83;
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  float fVar88;
  float fVar94;
  float fVar95;
  vfloat4 a0_1;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar96 [32];
  float fVar97;
  float fVar103;
  float fVar104;
  float fVar105;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  float fVar106;
  float fVar107;
  float fVar110;
  float fVar112;
  vfloat4 a0;
  float fVar114;
  undefined1 auVar108 [16];
  float fVar111;
  float fVar113;
  float fVar115;
  float fVar116;
  undefined1 auVar109 [32];
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar128;
  float fVar129;
  float fVar130;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  
  pBVar5 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.vertices.
           items;
  uVar4 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                                 super_CurveGeometry.field_0x68);
  pcVar6 = (pBVar5->super_RawBufferView).ptr_ofs;
  sVar7 = (pBVar5->super_RawBufferView).stride;
  lVar23 = sVar7 * uVar4;
  lVar24 = sVar7 * (uVar4 + 1);
  lVar21 = sVar7 * (uVar4 + 2);
  lVar22 = sVar7 * (uVar4 + 3);
  fVar57 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
           maxRadiusScale;
  auVar31 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + lVar23),
                          ZEXT416((uint)(fVar57 * *(float *)(pcVar6 + lVar23 + 0xc))),0x30);
  auVar30 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + lVar24),
                          ZEXT416((uint)(fVar57 * *(float *)(pcVar6 + lVar24 + 0xc))),0x30);
  auVar48 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + lVar21),
                          ZEXT416((uint)(fVar57 * *(float *)(pcVar6 + lVar21 + 0xc))),0x30);
  auVar25 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + lVar22),
                          ZEXT416((uint)(fVar57 * *(float *)(pcVar6 + lVar22 + 0xc))),0x30);
  pBVar8 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.normals.
           items;
  pcVar6 = (pBVar8->super_RawBufferView).ptr_ofs;
  sVar7 = (pBVar8->super_RawBufferView).stride;
  pfVar1 = (float *)(pcVar6 + uVar4 * sVar7);
  fVar62 = *pfVar1;
  fVar14 = pfVar1[1];
  fVar63 = pfVar1[2];
  fVar16 = pfVar1[3];
  pfVar1 = (float *)(pcVar6 + (uVar4 + 1) * sVar7);
  pfVar2 = (float *)(pcVar6 + (uVar4 + 2) * sVar7);
  pfVar3 = (float *)(pcVar6 + sVar7 * (uVar4 + 3));
  fVar64 = *pfVar3;
  fVar67 = pfVar3[1];
  fVar68 = pfVar3[2];
  fVar69 = pfVar3[3];
  fVar115 = auVar25._0_4_;
  fVar61 = auVar25._4_4_;
  fVar33 = auVar25._8_4_;
  fVar39 = auVar25._12_4_;
  fVar97 = auVar48._0_4_ * 0.0;
  fVar103 = auVar48._4_4_ * 0.0;
  fVar104 = auVar48._8_4_ * 0.0;
  fVar105 = auVar48._12_4_ * 0.0;
  fVar106 = fVar97 + fVar115 * 0.0;
  fVar110 = fVar103 + fVar61 * 0.0;
  fVar112 = fVar104 + fVar33 * 0.0;
  fVar114 = fVar105 + fVar39 * 0.0;
  auVar25._0_4_ = fVar106 + auVar30._0_4_ * 3.0;
  auVar25._4_4_ = fVar110 + auVar30._4_4_ * 3.0;
  auVar25._8_4_ = fVar112 + auVar30._8_4_ * 3.0;
  auVar25._12_4_ = fVar114 + auVar30._12_4_ * 3.0;
  fVar57 = auVar31._0_4_;
  auVar89._0_4_ = fVar57 * 3.0;
  fVar13 = auVar31._4_4_;
  auVar89._4_4_ = fVar13 * 3.0;
  fVar58 = auVar31._8_4_;
  auVar89._8_4_ = fVar58 * 3.0;
  fVar15 = auVar31._12_4_;
  auVar89._12_4_ = fVar15 * 3.0;
  auVar41 = vsubps_avx(auVar25,auVar89);
  fVar117 = *pfVar2 * 0.0;
  fVar119 = pfVar2[1] * 0.0;
  fVar121 = pfVar2[2] * 0.0;
  fVar123 = pfVar2[3] * 0.0;
  fVar124 = fVar117 + fVar64 * 0.0;
  fVar128 = fVar119 + fVar67 * 0.0;
  fVar129 = fVar121 + fVar68 * 0.0;
  fVar130 = fVar123 + fVar69 * 0.0;
  auVar90._0_4_ = *pfVar1 * 3.0 + fVar124;
  auVar90._4_4_ = pfVar1[1] * 3.0 + fVar128;
  auVar90._8_4_ = pfVar1[2] * 3.0 + fVar129;
  auVar90._12_4_ = pfVar1[3] * 3.0 + fVar130;
  auVar31._0_4_ = fVar62 * 3.0;
  auVar31._4_4_ = fVar14 * 3.0;
  auVar31._8_4_ = fVar63 * 3.0;
  auVar31._12_4_ = fVar16 * 3.0;
  auVar25 = vsubps_avx(auVar90,auVar31);
  fVar47 = auVar30._0_4_ * 0.0;
  fVar54 = auVar30._4_4_ * 0.0;
  fVar55 = auVar30._8_4_ * 0.0;
  fVar56 = auVar30._12_4_ * 0.0;
  auVar34._0_4_ = fVar57 + fVar106 + fVar47;
  auVar34._4_4_ = fVar13 + fVar110 + fVar54;
  auVar34._8_4_ = fVar58 + fVar112 + fVar55;
  auVar34._12_4_ = fVar15 + fVar114 + fVar56;
  fVar106 = *pfVar1 * 0.0;
  fVar110 = pfVar1[1] * 0.0;
  fVar112 = pfVar1[2] * 0.0;
  fVar114 = pfVar1[3] * 0.0;
  auVar108._0_4_ = fVar106 + fVar124 + fVar62;
  auVar108._4_4_ = fVar110 + fVar128 + fVar14;
  auVar108._8_4_ = fVar112 + fVar129 + fVar63;
  auVar108._12_4_ = fVar114 + fVar130 + fVar16;
  auVar125._0_4_ = fVar57 * 0.0;
  auVar125._4_4_ = fVar13 * 0.0;
  auVar125._8_4_ = fVar58 * 0.0;
  auVar125._12_4_ = fVar15 * 0.0;
  auVar29._0_4_ = auVar125._0_4_ + fVar97 + fVar115 + fVar47;
  auVar29._4_4_ = auVar125._4_4_ + fVar103 + fVar61 + fVar54;
  auVar29._8_4_ = auVar125._8_4_ + fVar104 + fVar33 + fVar55;
  auVar29._12_4_ = auVar125._12_4_ + fVar105 + fVar39 + fVar56;
  auVar59._0_4_ = fVar115 * 3.0;
  auVar59._4_4_ = fVar61 * 3.0;
  auVar59._8_4_ = fVar33 * 3.0;
  auVar59._12_4_ = fVar39 * 3.0;
  auVar98._0_4_ = auVar48._0_4_ * 3.0;
  auVar98._4_4_ = auVar48._4_4_ * 3.0;
  auVar98._8_4_ = auVar48._8_4_ * 3.0;
  auVar98._12_4_ = auVar48._12_4_ * 3.0;
  auVar31 = vsubps_avx(auVar59,auVar98);
  auVar48._0_4_ = fVar47 + auVar31._0_4_;
  auVar48._4_4_ = fVar54 + auVar31._4_4_;
  auVar48._8_4_ = fVar55 + auVar31._8_4_;
  auVar48._12_4_ = fVar56 + auVar31._12_4_;
  auVar53 = vsubps_avx(auVar48,auVar125);
  auVar65._0_4_ = fVar62 * 0.0;
  auVar65._4_4_ = fVar14 * 0.0;
  auVar65._8_4_ = fVar63 * 0.0;
  auVar65._12_4_ = fVar16 * 0.0;
  auVar49._0_4_ = auVar65._0_4_ + fVar106 + fVar117 + fVar64;
  auVar49._4_4_ = auVar65._4_4_ + fVar110 + fVar119 + fVar67;
  auVar49._8_4_ = auVar65._8_4_ + fVar112 + fVar121 + fVar68;
  auVar49._12_4_ = auVar65._12_4_ + fVar114 + fVar123 + fVar69;
  auVar76._0_4_ = fVar64 * 3.0;
  auVar76._4_4_ = fVar67 * 3.0;
  auVar76._8_4_ = fVar68 * 3.0;
  auVar76._12_4_ = fVar69 * 3.0;
  auVar70._0_4_ = *pfVar2 * 3.0;
  auVar70._4_4_ = pfVar2[1] * 3.0;
  auVar70._8_4_ = pfVar2[2] * 3.0;
  auVar70._12_4_ = pfVar2[3] * 3.0;
  auVar31 = vsubps_avx(auVar76,auVar70);
  auVar71._0_4_ = fVar106 + auVar31._0_4_;
  auVar71._4_4_ = fVar110 + auVar31._4_4_;
  auVar71._8_4_ = fVar112 + auVar31._8_4_;
  auVar71._12_4_ = fVar114 + auVar31._12_4_;
  auVar42 = vsubps_avx(auVar71,auVar65);
  auVar31 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar30 = vshufps_avx(auVar108,auVar108,0xc9);
  fVar57 = auVar41._0_4_;
  auVar77._0_4_ = auVar30._0_4_ * fVar57;
  fVar58 = auVar41._4_4_;
  auVar77._4_4_ = auVar30._4_4_ * fVar58;
  fVar62 = auVar41._8_4_;
  auVar77._8_4_ = auVar30._8_4_ * fVar62;
  fVar63 = auVar41._12_4_;
  auVar77._12_4_ = auVar30._12_4_ * fVar63;
  auVar84._0_4_ = auVar108._0_4_ * auVar31._0_4_;
  auVar84._4_4_ = auVar108._4_4_ * auVar31._4_4_;
  auVar84._8_4_ = auVar108._8_4_ * auVar31._8_4_;
  auVar84._12_4_ = auVar108._12_4_ * auVar31._12_4_;
  auVar30 = vsubps_avx(auVar84,auVar77);
  auVar48 = vshufps_avx(auVar30,auVar30,0xc9);
  auVar30 = vshufps_avx(auVar25,auVar25,0xc9);
  auVar85._0_4_ = auVar30._0_4_ * fVar57;
  auVar85._4_4_ = auVar30._4_4_ * fVar58;
  auVar85._8_4_ = auVar30._8_4_ * fVar62;
  auVar85._12_4_ = auVar30._12_4_ * fVar63;
  auVar72._0_4_ = auVar25._0_4_ * auVar31._0_4_;
  auVar72._4_4_ = auVar25._4_4_ * auVar31._4_4_;
  auVar72._8_4_ = auVar25._8_4_ * auVar31._8_4_;
  auVar72._12_4_ = auVar25._12_4_ * auVar31._12_4_;
  auVar31 = vsubps_avx(auVar72,auVar85);
  auVar25 = vshufps_avx(auVar31,auVar31,0xc9);
  auVar31 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar30 = vshufps_avx(auVar49,auVar49,0xc9);
  fVar13 = auVar53._0_4_;
  auVar91._0_4_ = auVar30._0_4_ * fVar13;
  fVar15 = auVar53._4_4_;
  auVar91._4_4_ = auVar30._4_4_ * fVar15;
  fVar14 = auVar53._8_4_;
  auVar91._8_4_ = auVar30._8_4_ * fVar14;
  fVar16 = auVar53._12_4_;
  auVar91._12_4_ = auVar30._12_4_ * fVar16;
  auVar50._0_4_ = auVar31._0_4_ * auVar49._0_4_;
  auVar50._4_4_ = auVar31._4_4_ * auVar49._4_4_;
  auVar50._8_4_ = auVar31._8_4_ * auVar49._8_4_;
  auVar50._12_4_ = auVar31._12_4_ * auVar49._12_4_;
  auVar30 = vsubps_avx(auVar50,auVar91);
  auVar17 = vshufps_avx(auVar30,auVar30,0xc9);
  auVar30 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar92._0_4_ = auVar30._0_4_ * fVar13;
  auVar92._4_4_ = auVar30._4_4_ * fVar15;
  auVar92._8_4_ = auVar30._8_4_ * fVar14;
  auVar92._12_4_ = auVar30._12_4_ * fVar16;
  auVar66._0_4_ = auVar31._0_4_ * auVar42._0_4_;
  auVar66._4_4_ = auVar31._4_4_ * auVar42._4_4_;
  auVar66._8_4_ = auVar31._8_4_ * auVar42._8_4_;
  auVar66._12_4_ = auVar31._12_4_ * auVar42._12_4_;
  auVar31 = vdpps_avx(auVar48,auVar48,0x7f);
  auVar30 = vsubps_avx(auVar66,auVar92);
  auVar42 = vshufps_avx(auVar30,auVar30,0xc9);
  fVar47 = auVar31._0_4_;
  auVar40._4_12_ = SUB1612(ZEXT816(0),0);
  auVar93._4_12_ = auVar40._4_12_;
  auVar93._0_4_ = fVar47;
  auVar30 = vrsqrtss_avx(auVar93,auVar93);
  fVar64 = auVar30._0_4_;
  auVar30 = ZEXT416((uint)(fVar64 * 1.5 - fVar47 * 0.5 * fVar64 * fVar64 * fVar64));
  auVar49 = vshufps_avx(auVar30,auVar30,0);
  fVar64 = auVar48._0_4_ * auVar49._0_4_;
  fVar67 = auVar48._4_4_ * auVar49._4_4_;
  fVar68 = auVar48._8_4_ * auVar49._8_4_;
  fVar69 = auVar48._12_4_ * auVar49._12_4_;
  auVar31 = vshufps_avx(auVar31,auVar31,0);
  auVar126._0_4_ = auVar31._0_4_ * auVar25._0_4_;
  auVar126._4_4_ = auVar31._4_4_ * auVar25._4_4_;
  auVar126._8_4_ = auVar31._8_4_ * auVar25._8_4_;
  auVar126._12_4_ = auVar31._12_4_ * auVar25._12_4_;
  auVar31 = vdpps_avx(auVar48,auVar25,0x7f);
  auVar31 = vshufps_avx(auVar31,auVar31,0);
  auVar78._0_4_ = auVar31._0_4_ * auVar48._0_4_;
  auVar78._4_4_ = auVar31._4_4_ * auVar48._4_4_;
  auVar78._8_4_ = auVar31._8_4_ * auVar48._8_4_;
  auVar78._12_4_ = auVar31._12_4_ * auVar48._12_4_;
  auVar50 = vsubps_avx(auVar126,auVar78);
  auVar30 = vrcpss_avx(auVar93,auVar93);
  auVar31 = vdpps_avx(auVar17,auVar17,0x7f);
  auVar30 = ZEXT416((uint)(auVar30._0_4_ * (2.0 - fVar47 * auVar30._0_4_)));
  auVar48 = vshufps_avx(auVar30,auVar30,0);
  fVar54 = auVar31._0_4_;
  auVar40._0_4_ = fVar54;
  auVar30 = vrsqrtss_avx(auVar40,auVar40);
  fVar47 = auVar30._0_4_;
  auVar30 = ZEXT416((uint)(fVar47 * 1.5 - fVar54 * 0.5 * fVar47 * fVar47 * fVar47));
  auVar25 = vshufps_avx(auVar30,auVar30,0);
  auVar30 = vdpps_avx(auVar17,auVar42,0x7f);
  fVar47 = auVar25._0_4_ * auVar17._0_4_;
  fVar55 = auVar25._4_4_ * auVar17._4_4_;
  fVar56 = auVar25._8_4_ * auVar17._8_4_;
  fVar115 = auVar25._12_4_ * auVar17._12_4_;
  auVar31 = vshufps_avx(auVar31,auVar31,0);
  auVar73._0_4_ = auVar31._0_4_ * auVar42._0_4_;
  auVar73._4_4_ = auVar31._4_4_ * auVar42._4_4_;
  auVar73._8_4_ = auVar31._8_4_ * auVar42._8_4_;
  auVar73._12_4_ = auVar31._12_4_ * auVar42._12_4_;
  auVar31 = vshufps_avx(auVar30,auVar30,0);
  auVar51._0_4_ = auVar31._0_4_ * auVar17._0_4_;
  auVar51._4_4_ = auVar31._4_4_ * auVar17._4_4_;
  auVar51._8_4_ = auVar31._8_4_ * auVar17._8_4_;
  auVar51._12_4_ = auVar31._12_4_ * auVar17._12_4_;
  auVar42 = vsubps_avx(auVar73,auVar51);
  auVar31 = vrcpss_avx(auVar40,auVar40);
  auVar31 = ZEXT416((uint)(auVar31._0_4_ * (2.0 - fVar54 * auVar31._0_4_)));
  auVar31 = vshufps_avx(auVar31,auVar31,0);
  auVar30 = vshufps_avx(auVar34,auVar34,0xff);
  auVar74._0_4_ = auVar30._0_4_ * fVar64;
  auVar74._4_4_ = auVar30._4_4_ * fVar67;
  auVar74._8_4_ = auVar30._8_4_ * fVar68;
  auVar74._12_4_ = auVar30._12_4_ * fVar69;
  auVar40 = vsubps_avx(auVar34,auVar74);
  auVar17 = vshufps_avx(auVar41,auVar41,0xff);
  auVar52._0_4_ =
       auVar17._0_4_ * fVar64 + auVar49._0_4_ * auVar50._0_4_ * auVar48._0_4_ * auVar30._0_4_;
  auVar52._4_4_ =
       auVar17._4_4_ * fVar67 + auVar49._4_4_ * auVar50._4_4_ * auVar48._4_4_ * auVar30._4_4_;
  auVar52._8_4_ =
       auVar17._8_4_ * fVar68 + auVar49._8_4_ * auVar50._8_4_ * auVar48._8_4_ * auVar30._8_4_;
  auVar52._12_4_ =
       auVar17._12_4_ * fVar69 + auVar49._12_4_ * auVar50._12_4_ * auVar48._12_4_ * auVar30._12_4_;
  auVar17 = vsubps_avx(auVar41,auVar52);
  local_228._4_4_ = auVar34._4_4_ + auVar74._4_4_;
  local_228._0_4_ = auVar34._0_4_ + auVar74._0_4_;
  fStack_220 = auVar34._8_4_ + auVar74._8_4_;
  fStack_21c = auVar34._12_4_ + auVar74._12_4_;
  auVar30 = vshufps_avx(auVar29,auVar29,0xff);
  auVar75._0_4_ = fVar47 * auVar30._0_4_;
  auVar75._4_4_ = fVar55 * auVar30._4_4_;
  auVar75._8_4_ = fVar56 * auVar30._8_4_;
  auVar75._12_4_ = fVar115 * auVar30._12_4_;
  auVar49 = vsubps_avx(auVar29,auVar75);
  auVar48 = vshufps_avx(auVar53,auVar53,0xff);
  auVar41._0_4_ =
       auVar48._0_4_ * fVar47 + auVar30._0_4_ * auVar25._0_4_ * auVar42._0_4_ * auVar31._0_4_;
  auVar41._4_4_ =
       auVar48._4_4_ * fVar55 + auVar30._4_4_ * auVar25._4_4_ * auVar42._4_4_ * auVar31._4_4_;
  auVar41._8_4_ =
       auVar48._8_4_ * fVar56 + auVar30._8_4_ * auVar25._8_4_ * auVar42._8_4_ * auVar31._8_4_;
  auVar41._12_4_ =
       auVar48._12_4_ * fVar115 + auVar30._12_4_ * auVar25._12_4_ * auVar42._12_4_ * auVar31._12_4_;
  auVar31 = vsubps_avx(auVar53,auVar41);
  auVar53._0_4_ = auVar31._0_4_ * 0.33333334;
  auVar53._4_4_ = auVar31._4_4_ * 0.33333334;
  auVar53._8_4_ = auVar31._8_4_ * 0.33333334;
  auVar53._12_4_ = auVar31._12_4_ * 0.33333334;
  auVar42 = vsubps_avx(auVar49,auVar53);
  local_1f8._4_4_ = (fVar15 + auVar41._4_4_) * 0.33333334;
  local_1f8._0_4_ = (fVar13 + auVar41._0_4_) * 0.33333334;
  fStack_1f0 = (fVar14 + auVar41._8_4_) * 0.33333334;
  fStack_1ec = (fVar16 + auVar41._12_4_) * 0.33333334;
  auVar31 = vshufps_avx(auVar42,auVar42,0);
  auVar30 = vshufps_avx(auVar42,auVar42,0x55);
  auVar48 = vshufps_avx(auVar49,auVar49,0);
  auVar25 = vshufps_avx(auVar49,auVar49,0x55);
  fVar118 = auVar48._0_4_;
  fVar120 = auVar48._4_4_;
  fVar122 = auVar48._8_4_;
  fVar33 = auVar31._0_4_;
  fVar39 = auVar31._4_4_;
  fVar106 = auVar31._8_4_;
  fVar110 = auVar31._12_4_;
  fVar13 = auVar25._0_4_;
  fVar64 = auVar25._4_4_;
  fVar47 = auVar25._8_4_;
  fVar112 = auVar30._0_4_;
  fVar97 = auVar30._4_4_;
  fVar104 = auVar30._8_4_;
  fVar117 = auVar30._12_4_;
  auVar31 = vshufps_avx(auVar42,auVar42,0xaa);
  auVar30 = vshufps_avx(auVar49,auVar49,0xaa);
  fVar15 = auVar30._0_4_;
  fVar67 = auVar30._4_4_;
  fVar54 = auVar30._8_4_;
  fVar115 = auVar30._12_4_;
  fVar114 = auVar31._0_4_;
  fVar103 = auVar31._4_4_;
  fVar105 = auVar31._8_4_;
  fVar119 = auVar31._12_4_;
  auVar42._0_4_ = auVar40._0_4_ + auVar17._0_4_ * 0.33333334;
  auVar42._4_4_ = auVar40._4_4_ + auVar17._4_4_ * 0.33333334;
  auVar42._8_4_ = auVar40._8_4_ + auVar17._8_4_ * 0.33333334;
  auVar42._12_4_ = auVar40._12_4_ + auVar17._12_4_ * 0.33333334;
  auVar31 = vshufps_avx(auVar42,auVar42,0);
  fVar129 = auVar31._0_4_;
  fVar130 = auVar31._4_4_;
  fVar82 = auVar31._8_4_;
  fVar83 = auVar31._12_4_;
  auVar31 = vshufps_avx(auVar42,auVar42,0x55);
  fVar107 = auVar31._0_4_;
  fVar111 = auVar31._4_4_;
  fVar113 = auVar31._8_4_;
  fVar116 = auVar31._12_4_;
  auVar31 = vshufps_avx(auVar42,auVar42,0xaa);
  fVar121 = auVar31._0_4_;
  fVar123 = auVar31._4_4_;
  fVar124 = auVar31._8_4_;
  fVar128 = auVar31._12_4_;
  auVar31 = vshufps_avx(auVar40,auVar40,0);
  fVar14 = auVar31._0_4_;
  fVar68 = auVar31._4_4_;
  fVar55 = auVar31._8_4_;
  fVar61 = auVar31._12_4_;
  auVar127._0_4_ =
       (float)bezier_basis0._476_4_ * fVar14 +
       fVar129 * (float)bezier_basis0._1632_4_ +
       fVar33 * (float)bezier_basis0._2788_4_ + fVar118 * (float)bezier_basis0._3944_4_;
  auVar127._4_4_ =
       (float)bezier_basis0._480_4_ * fVar68 +
       fVar130 * (float)bezier_basis0._1636_4_ +
       fVar39 * (float)bezier_basis0._2792_4_ + fVar120 * (float)bezier_basis0._3948_4_;
  auVar127._8_4_ =
       (float)bezier_basis0._484_4_ * fVar55 +
       fVar82 * (float)bezier_basis0._1640_4_ +
       fVar106 * (float)bezier_basis0._2796_4_ + fVar122 * (float)bezier_basis0._3952_4_;
  auVar127._12_4_ =
       (float)bezier_basis0._488_4_ * fVar61 +
       fVar83 * (float)bezier_basis0._1644_4_ +
       fVar110 * (float)bezier_basis0._2800_4_ + auVar48._12_4_ * (float)bezier_basis0._3956_4_;
  auVar127._16_4_ =
       (float)bezier_basis0._492_4_ * fVar14 +
       fVar129 * (float)bezier_basis0._1648_4_ +
       fVar33 * (float)bezier_basis0._2804_4_ + fVar118 * (float)bezier_basis0._3960_4_;
  auVar127._20_4_ =
       (float)bezier_basis0._496_4_ * fVar68 +
       fVar130 * (float)bezier_basis0._1652_4_ +
       fVar39 * (float)bezier_basis0._2808_4_ + fVar120 * (float)bezier_basis0._3964_4_;
  auVar127._24_4_ =
       (float)bezier_basis0._500_4_ * fVar55 +
       fVar82 * (float)bezier_basis0._1656_4_ +
       fVar106 * (float)bezier_basis0._2812_4_ + fVar122 * (float)bezier_basis0._3968_4_;
  auVar127._28_4_ = fVar110 + 0.0 + 0.0 + 0.0;
  auVar31 = vshufps_avx(auVar40,auVar40,0x55);
  fVar88 = auVar31._0_4_;
  fVar94 = auVar31._4_4_;
  fVar95 = auVar31._8_4_;
  auVar100._0_4_ =
       fVar107 * (float)bezier_basis0._1632_4_ +
       fVar112 * (float)bezier_basis0._2788_4_ + (float)bezier_basis0._3944_4_ * fVar13 +
       fVar88 * (float)bezier_basis0._476_4_;
  auVar100._4_4_ =
       fVar111 * (float)bezier_basis0._1636_4_ +
       fVar97 * (float)bezier_basis0._2792_4_ + (float)bezier_basis0._3948_4_ * fVar64 +
       fVar94 * (float)bezier_basis0._480_4_;
  auVar100._8_4_ =
       fVar113 * (float)bezier_basis0._1640_4_ +
       fVar104 * (float)bezier_basis0._2796_4_ + (float)bezier_basis0._3952_4_ * fVar47 +
       fVar95 * (float)bezier_basis0._484_4_;
  auVar100._12_4_ =
       fVar116 * (float)bezier_basis0._1644_4_ +
       fVar117 * (float)bezier_basis0._2800_4_ + (float)bezier_basis0._3956_4_ * auVar25._12_4_ +
       auVar31._12_4_ * (float)bezier_basis0._488_4_;
  auVar100._16_4_ =
       fVar107 * (float)bezier_basis0._1648_4_ +
       fVar112 * (float)bezier_basis0._2804_4_ + (float)bezier_basis0._3960_4_ * fVar13 +
       fVar88 * (float)bezier_basis0._492_4_;
  auVar100._20_4_ =
       fVar111 * (float)bezier_basis0._1652_4_ +
       fVar97 * (float)bezier_basis0._2808_4_ + (float)bezier_basis0._3964_4_ * fVar64 +
       fVar94 * (float)bezier_basis0._496_4_;
  auVar100._24_4_ =
       fVar113 * (float)bezier_basis0._1656_4_ +
       fVar104 * (float)bezier_basis0._2812_4_ + (float)bezier_basis0._3968_4_ * fVar47 +
       fVar95 * (float)bezier_basis0._500_4_;
  auVar100._28_4_ = fVar117 + fVar110 + 0.0 + (float)bezier_basis0._1660_4_;
  auVar30 = vshufps_avx(auVar40,auVar40,0xaa);
  fVar16 = auVar30._0_4_;
  fVar69 = auVar30._4_4_;
  fVar56 = auVar30._8_4_;
  auVar60._0_4_ =
       (float)bezier_basis0._476_4_ * fVar16 +
       fVar121 * (float)bezier_basis0._1632_4_ +
       fVar114 * (float)bezier_basis0._2788_4_ + (float)bezier_basis0._3944_4_ * fVar15;
  auVar60._4_4_ =
       (float)bezier_basis0._480_4_ * fVar69 +
       fVar123 * (float)bezier_basis0._1636_4_ +
       fVar103 * (float)bezier_basis0._2792_4_ + (float)bezier_basis0._3948_4_ * fVar67;
  auVar60._8_4_ =
       (float)bezier_basis0._484_4_ * fVar56 +
       fVar124 * (float)bezier_basis0._1640_4_ +
       fVar105 * (float)bezier_basis0._2796_4_ + (float)bezier_basis0._3952_4_ * fVar54;
  auVar60._12_4_ =
       (float)bezier_basis0._488_4_ * auVar30._12_4_ +
       fVar128 * (float)bezier_basis0._1644_4_ +
       fVar119 * (float)bezier_basis0._2800_4_ + (float)bezier_basis0._3956_4_ * fVar115;
  auVar60._16_4_ =
       (float)bezier_basis0._492_4_ * fVar16 +
       fVar121 * (float)bezier_basis0._1648_4_ +
       fVar114 * (float)bezier_basis0._2804_4_ + (float)bezier_basis0._3960_4_ * fVar15;
  auVar60._20_4_ =
       (float)bezier_basis0._496_4_ * fVar69 +
       fVar123 * (float)bezier_basis0._1652_4_ +
       fVar103 * (float)bezier_basis0._2808_4_ + (float)bezier_basis0._3964_4_ * fVar67;
  auVar60._24_4_ =
       (float)bezier_basis0._500_4_ * fVar56 +
       fVar124 * (float)bezier_basis0._1656_4_ +
       fVar105 * (float)bezier_basis0._2812_4_ + (float)bezier_basis0._3968_4_ * fVar54;
  auVar60._28_4_ = fVar117 + fVar110 + fVar119 + 0.0 + 0.0;
  auVar79._0_4_ =
       fVar129 * (float)bezier_basis0._6256_4_ +
       (float)bezier_basis0._7412_4_ * fVar33 + fVar118 * (float)bezier_basis0._8568_4_ +
       fVar14 * (float)bezier_basis0._5100_4_;
  auVar79._4_4_ =
       fVar130 * (float)bezier_basis0._6260_4_ +
       (float)bezier_basis0._7416_4_ * fVar39 + fVar120 * (float)bezier_basis0._8572_4_ +
       fVar68 * (float)bezier_basis0._5104_4_;
  auVar79._8_4_ =
       fVar82 * (float)bezier_basis0._6264_4_ +
       (float)bezier_basis0._7420_4_ * fVar106 + fVar122 * (float)bezier_basis0._8576_4_ +
       fVar55 * (float)bezier_basis0._5108_4_;
  auVar79._12_4_ =
       fVar83 * (float)bezier_basis0._6268_4_ +
       (float)bezier_basis0._7424_4_ * fVar110 + auVar48._12_4_ * (float)bezier_basis0._8580_4_ +
       fVar61 * (float)bezier_basis0._5112_4_;
  auVar79._16_4_ =
       fVar129 * (float)bezier_basis0._6272_4_ +
       (float)bezier_basis0._7428_4_ * fVar33 + fVar118 * (float)bezier_basis0._8584_4_ +
       fVar14 * (float)bezier_basis0._5116_4_;
  auVar79._20_4_ =
       fVar130 * (float)bezier_basis0._6276_4_ +
       (float)bezier_basis0._7432_4_ * fVar39 + fVar120 * (float)bezier_basis0._8588_4_ +
       fVar68 * (float)bezier_basis0._5120_4_;
  auVar79._24_4_ =
       fVar82 * (float)bezier_basis0._6280_4_ +
       (float)bezier_basis0._7436_4_ * fVar106 + fVar122 * (float)bezier_basis0._8592_4_ +
       fVar55 * (float)bezier_basis0._5124_4_;
  auVar79._28_4_ = fVar83 + (float)bezier_basis0._504_4_ + 0.0 + fVar61;
  auVar86._0_4_ =
       fVar107 * (float)bezier_basis0._6256_4_ +
       (float)bezier_basis0._7412_4_ * fVar112 + (float)bezier_basis0._8568_4_ * fVar13 +
       fVar88 * (float)bezier_basis0._5100_4_;
  auVar86._4_4_ =
       fVar111 * (float)bezier_basis0._6260_4_ +
       (float)bezier_basis0._7416_4_ * fVar97 + (float)bezier_basis0._8572_4_ * fVar64 +
       fVar94 * (float)bezier_basis0._5104_4_;
  auVar86._8_4_ =
       fVar113 * (float)bezier_basis0._6264_4_ +
       (float)bezier_basis0._7420_4_ * fVar104 + (float)bezier_basis0._8576_4_ * fVar47 +
       fVar95 * (float)bezier_basis0._5108_4_;
  auVar86._12_4_ =
       fVar116 * (float)bezier_basis0._6268_4_ +
       (float)bezier_basis0._7424_4_ * fVar117 + (float)bezier_basis0._8580_4_ * auVar25._12_4_ +
       auVar31._12_4_ * (float)bezier_basis0._5112_4_;
  auVar86._16_4_ =
       fVar107 * (float)bezier_basis0._6272_4_ +
       (float)bezier_basis0._7428_4_ * fVar112 + (float)bezier_basis0._8584_4_ * fVar13 +
       fVar88 * (float)bezier_basis0._5116_4_;
  auVar86._20_4_ =
       fVar111 * (float)bezier_basis0._6276_4_ +
       (float)bezier_basis0._7432_4_ * fVar97 + (float)bezier_basis0._8588_4_ * fVar64 +
       fVar94 * (float)bezier_basis0._5120_4_;
  auVar86._24_4_ =
       fVar113 * (float)bezier_basis0._6280_4_ +
       (float)bezier_basis0._7436_4_ * fVar104 + (float)bezier_basis0._8592_4_ * fVar47 +
       fVar95 * (float)bezier_basis0._5124_4_;
  auVar86._28_4_ = (float)bezier_basis0._504_4_ + 0.0 + 0.0 + (float)bezier_basis0._7440_4_;
  auVar35._0_4_ =
       fVar16 * (float)bezier_basis0._5100_4_ +
       fVar121 * (float)bezier_basis0._6256_4_ +
       (float)bezier_basis0._7412_4_ * fVar114 + fVar15 * (float)bezier_basis0._8568_4_;
  auVar35._4_4_ =
       fVar69 * (float)bezier_basis0._5104_4_ +
       fVar123 * (float)bezier_basis0._6260_4_ +
       (float)bezier_basis0._7416_4_ * fVar103 + fVar67 * (float)bezier_basis0._8572_4_;
  auVar35._8_4_ =
       fVar56 * (float)bezier_basis0._5108_4_ +
       fVar124 * (float)bezier_basis0._6264_4_ +
       (float)bezier_basis0._7420_4_ * fVar105 + fVar54 * (float)bezier_basis0._8576_4_;
  auVar35._12_4_ =
       auVar30._12_4_ * (float)bezier_basis0._5112_4_ +
       fVar128 * (float)bezier_basis0._6268_4_ +
       (float)bezier_basis0._7424_4_ * fVar119 + fVar115 * (float)bezier_basis0._8580_4_;
  auVar35._16_4_ =
       fVar16 * (float)bezier_basis0._5116_4_ +
       fVar121 * (float)bezier_basis0._6272_4_ +
       (float)bezier_basis0._7428_4_ * fVar114 + fVar15 * (float)bezier_basis0._8584_4_;
  auVar35._20_4_ =
       fVar69 * (float)bezier_basis0._5120_4_ +
       fVar123 * (float)bezier_basis0._6276_4_ +
       (float)bezier_basis0._7432_4_ * fVar103 + fVar67 * (float)bezier_basis0._8588_4_;
  auVar35._24_4_ =
       fVar56 * (float)bezier_basis0._5124_4_ +
       fVar124 * (float)bezier_basis0._6280_4_ +
       (float)bezier_basis0._7436_4_ * fVar105 + fVar54 * (float)bezier_basis0._8592_4_;
  auVar35._28_4_ = (float)bezier_basis0._5128_4_ + fVar128 + fVar115 + 0.0;
  auVar96 = ZEXT1232(ZEXT412(0)) << 0x20;
  auVar9 = vblendps_avx(auVar79,auVar96,1);
  auVar10._4_4_ = auVar9._4_4_ * 0.055555556;
  auVar10._0_4_ = auVar9._0_4_ * 0.055555556;
  auVar10._8_4_ = auVar9._8_4_ * 0.055555556;
  auVar10._12_4_ = auVar9._12_4_ * 0.055555556;
  auVar10._16_4_ = auVar9._16_4_ * 0.055555556;
  auVar10._20_4_ = auVar9._20_4_ * 0.055555556;
  auVar10._24_4_ = auVar9._24_4_ * 0.055555556;
  auVar10._28_4_ = auVar9._28_4_;
  auVar27 = vsubps_avx(auVar127,auVar10);
  auVar9 = vblendps_avx(auVar79,auVar96,0x80);
  auVar26._0_4_ = auVar127._0_4_ + auVar9._0_4_ * 0.055555556;
  auVar26._4_4_ = auVar127._4_4_ + auVar9._4_4_ * 0.055555556;
  auVar26._8_4_ = auVar127._8_4_ + auVar9._8_4_ * 0.055555556;
  auVar26._12_4_ = auVar127._12_4_ + auVar9._12_4_ * 0.055555556;
  auVar26._16_4_ = auVar127._16_4_ + auVar9._16_4_ * 0.055555556;
  auVar26._20_4_ = auVar127._20_4_ + auVar9._20_4_ * 0.055555556;
  auVar26._24_4_ = auVar127._24_4_ + auVar9._24_4_ * 0.055555556;
  auVar26._28_4_ = auVar127._28_4_ + auVar9._28_4_;
  auVar43._8_4_ = 0x7f800000;
  auVar43._0_8_ = 0x7f8000007f800000;
  auVar43._12_4_ = 0x7f800000;
  auVar43._16_4_ = 0x7f800000;
  auVar43._20_4_ = 0x7f800000;
  auVar43._24_4_ = 0x7f800000;
  auVar43._28_4_ = 0x7f800000;
  auVar9 = vminps_avx(auVar43,auVar127);
  auVar10 = vminps_avx(auVar27,auVar26);
  auVar79 = vminps_avx(auVar9,auVar10);
  auVar36 = ZEXT1232(ZEXT412(0)) << 0x20;
  auVar9 = vblendps_avx(auVar86,auVar36,1);
  auVar96._4_4_ = auVar9._4_4_ * 0.055555556;
  auVar96._0_4_ = auVar9._0_4_ * 0.055555556;
  auVar96._8_4_ = auVar9._8_4_ * 0.055555556;
  auVar96._12_4_ = auVar9._12_4_ * 0.055555556;
  auVar96._16_4_ = auVar9._16_4_ * 0.055555556;
  auVar96._20_4_ = auVar9._20_4_ * 0.055555556;
  auVar96._24_4_ = auVar9._24_4_ * 0.055555556;
  auVar96._28_4_ = auVar9._28_4_;
  auVar96 = vsubps_avx(auVar100,auVar96);
  auVar9 = vblendps_avx(auVar86,auVar36,0x80);
  auVar80._0_4_ = auVar100._0_4_ + auVar9._0_4_ * 0.055555556;
  auVar80._4_4_ = auVar100._4_4_ + auVar9._4_4_ * 0.055555556;
  auVar80._8_4_ = auVar100._8_4_ + auVar9._8_4_ * 0.055555556;
  auVar80._12_4_ = auVar100._12_4_ + auVar9._12_4_ * 0.055555556;
  auVar80._16_4_ = auVar100._16_4_ + auVar9._16_4_ * 0.055555556;
  auVar80._20_4_ = auVar100._20_4_ + auVar9._20_4_ * 0.055555556;
  auVar80._24_4_ = auVar100._24_4_ + auVar9._24_4_ * 0.055555556;
  auVar80._28_4_ = auVar100._28_4_ + auVar9._28_4_;
  auVar9 = vminps_avx(auVar43,auVar100);
  auVar10 = vminps_avx(auVar96,auVar80);
  auVar86 = vminps_avx(auVar9,auVar10);
  auVar9 = vblendps_avx(auVar35,auVar36,1);
  auVar19._4_4_ = auVar9._4_4_ * 0.055555556;
  auVar19._0_4_ = auVar9._0_4_ * 0.055555556;
  auVar19._8_4_ = auVar9._8_4_ * 0.055555556;
  auVar19._12_4_ = auVar9._12_4_ * 0.055555556;
  auVar19._16_4_ = auVar9._16_4_ * 0.055555556;
  auVar19._20_4_ = auVar9._20_4_ * 0.055555556;
  auVar19._24_4_ = auVar9._24_4_ * 0.055555556;
  auVar19._28_4_ = auVar9._28_4_;
  auVar19 = vsubps_avx(auVar60,auVar19);
  auVar9 = vblendps_avx(auVar35,auVar36,0x80);
  auVar36._0_4_ = auVar60._0_4_ + auVar9._0_4_ * 0.055555556;
  auVar36._4_4_ = auVar60._4_4_ + auVar9._4_4_ * 0.055555556;
  auVar36._8_4_ = auVar60._8_4_ + auVar9._8_4_ * 0.055555556;
  auVar36._12_4_ = auVar60._12_4_ + auVar9._12_4_ * 0.055555556;
  auVar36._16_4_ = auVar60._16_4_ + auVar9._16_4_ * 0.055555556;
  auVar36._20_4_ = auVar60._20_4_ + auVar9._20_4_ * 0.055555556;
  auVar36._24_4_ = auVar60._24_4_ + auVar9._24_4_ * 0.055555556;
  auVar36._28_4_ = auVar60._28_4_ + auVar9._28_4_;
  auVar9 = vminps_avx(auVar43,auVar60);
  auVar10 = vminps_avx(auVar19,auVar36);
  auVar11 = vminps_avx(auVar9,auVar10);
  auVar9 = vmaxps_avx(auVar27,auVar26);
  auVar44._8_4_ = 0xff800000;
  auVar44._0_8_ = 0xff800000ff800000;
  auVar44._12_4_ = 0xff800000;
  auVar44._16_4_ = 0xff800000;
  auVar44._20_4_ = 0xff800000;
  auVar44._24_4_ = 0xff800000;
  auVar44._28_4_ = 0xff800000;
  auVar10 = vmaxps_avx(auVar44,auVar127);
  auVar35 = vmaxps_avx(auVar10,auVar9);
  auVar9 = vmaxps_avx(auVar96,auVar80);
  auVar10 = vmaxps_avx(auVar44,auVar100);
  auVar43 = vmaxps_avx(auVar10,auVar9);
  auVar9 = vmaxps_avx(auVar19,auVar36);
  auVar10 = vmaxps_avx(auVar44,auVar60);
  auVar36 = vmaxps_avx(auVar10,auVar9);
  auVar17._4_4_ = auVar29._4_4_ + auVar75._4_4_;
  auVar17._0_4_ = auVar29._0_4_ + auVar75._0_4_;
  auVar17._8_4_ = auVar29._8_4_ + auVar75._8_4_;
  auVar17._12_4_ = auVar29._12_4_ + auVar75._12_4_;
  auVar25 = vsubps_avx(auVar17,_local_1f8);
  auVar31 = vshufps_avx(auVar25,auVar25,0);
  auVar30 = vshufps_avx(auVar17,auVar17,0);
  fVar13 = auVar30._0_4_;
  fVar67 = auVar30._4_4_;
  fVar55 = auVar30._8_4_;
  fVar39 = auVar30._12_4_;
  fVar15 = auVar31._0_4_;
  fVar68 = auVar31._4_4_;
  fVar56 = auVar31._8_4_;
  auVar30 = vshufps_avx(auVar25,auVar25,0x55);
  auVar48 = vshufps_avx(auVar17,auVar17,0x55);
  fVar14 = auVar48._0_4_;
  fVar69 = auVar48._4_4_;
  fVar115 = auVar48._8_4_;
  fVar106 = auVar48._12_4_;
  fVar16 = auVar30._0_4_;
  fVar47 = auVar30._4_4_;
  fVar61 = auVar30._8_4_;
  fVar110 = auVar30._12_4_;
  auVar30 = vshufps_avx(auVar25,auVar25,0xaa);
  auVar48 = vshufps_avx(auVar17,auVar17,0xaa);
  fVar128 = auVar48._0_4_;
  fVar129 = auVar48._4_4_;
  fVar130 = auVar48._8_4_;
  fVar82 = auVar48._12_4_;
  fVar64 = auVar30._0_4_;
  fVar54 = auVar30._4_4_;
  fVar33 = auVar30._8_4_;
  fVar112 = auVar30._12_4_;
  auVar99._0_4_ = auVar34._0_4_ + auVar74._0_4_ + (fVar57 + auVar52._0_4_) * 0.33333334;
  auVar99._4_4_ = auVar34._4_4_ + auVar74._4_4_ + (fVar58 + auVar52._4_4_) * 0.33333334;
  auVar99._8_4_ = auVar34._8_4_ + auVar74._8_4_ + (fVar62 + auVar52._8_4_) * 0.33333334;
  auVar99._12_4_ = auVar34._12_4_ + auVar74._12_4_ + (fVar63 + auVar52._12_4_) * 0.33333334;
  auVar30 = vshufps_avx(auVar99,auVar99,0);
  fVar121 = auVar30._0_4_;
  fVar123 = auVar30._4_4_;
  fVar124 = auVar30._8_4_;
  auVar48 = vshufps_avx(auVar99,auVar99,0x55);
  fVar97 = auVar48._0_4_;
  fVar103 = auVar48._4_4_;
  fVar104 = auVar48._8_4_;
  auVar25 = vshufps_avx(auVar99,auVar99,0xaa);
  fVar83 = auVar25._0_4_;
  fVar88 = auVar25._4_4_;
  fVar94 = auVar25._8_4_;
  auVar17 = vshufps_avx(_local_228,_local_228,0);
  fVar58 = auVar17._0_4_;
  fVar62 = auVar17._4_4_;
  fVar63 = auVar17._8_4_;
  auVar32._0_4_ =
       fVar121 * (float)bezier_basis0._1632_4_ +
       (float)bezier_basis0._2788_4_ * fVar15 + (float)bezier_basis0._3944_4_ * fVar13 +
       fVar58 * (float)bezier_basis0._476_4_;
  auVar32._4_4_ =
       fVar123 * (float)bezier_basis0._1636_4_ +
       (float)bezier_basis0._2792_4_ * fVar68 + (float)bezier_basis0._3948_4_ * fVar67 +
       fVar62 * (float)bezier_basis0._480_4_;
  auVar32._8_4_ =
       fVar124 * (float)bezier_basis0._1640_4_ +
       (float)bezier_basis0._2796_4_ * fVar56 + (float)bezier_basis0._3952_4_ * fVar55 +
       fVar63 * (float)bezier_basis0._484_4_;
  auVar32._12_4_ =
       auVar30._12_4_ * (float)bezier_basis0._1644_4_ +
       (float)bezier_basis0._2800_4_ * auVar31._12_4_ + (float)bezier_basis0._3956_4_ * fVar39 +
       auVar17._12_4_ * (float)bezier_basis0._488_4_;
  auVar32._16_4_ =
       fVar121 * (float)bezier_basis0._1648_4_ +
       (float)bezier_basis0._2804_4_ * fVar15 + (float)bezier_basis0._3960_4_ * fVar13 +
       fVar58 * (float)bezier_basis0._492_4_;
  auVar32._20_4_ =
       fVar123 * (float)bezier_basis0._1652_4_ +
       (float)bezier_basis0._2808_4_ * fVar68 + (float)bezier_basis0._3964_4_ * fVar67 +
       fVar62 * (float)bezier_basis0._496_4_;
  auVar32._24_4_ =
       fVar124 * (float)bezier_basis0._1656_4_ +
       (float)bezier_basis0._2812_4_ * fVar56 + (float)bezier_basis0._3968_4_ * fVar55 +
       fVar63 * (float)bezier_basis0._500_4_;
  auVar32._28_4_ = fVar116 + 0.0 + (float)bezier_basis0._1660_4_;
  auVar42 = vshufps_avx(_local_228,_local_228,0x55);
  fVar105 = auVar42._0_4_;
  fVar117 = auVar42._4_4_;
  fVar119 = auVar42._8_4_;
  auVar109._0_4_ =
       fVar105 * (float)bezier_basis0._476_4_ +
       (float)bezier_basis0._2788_4_ * fVar16 + (float)bezier_basis0._3944_4_ * fVar14 +
       fVar97 * (float)bezier_basis0._1632_4_;
  auVar109._4_4_ =
       fVar117 * (float)bezier_basis0._480_4_ +
       (float)bezier_basis0._2792_4_ * fVar47 + (float)bezier_basis0._3948_4_ * fVar69 +
       fVar103 * (float)bezier_basis0._1636_4_;
  auVar109._8_4_ =
       fVar119 * (float)bezier_basis0._484_4_ +
       (float)bezier_basis0._2796_4_ * fVar61 + (float)bezier_basis0._3952_4_ * fVar115 +
       fVar104 * (float)bezier_basis0._1640_4_;
  auVar109._12_4_ =
       auVar42._12_4_ * (float)bezier_basis0._488_4_ +
       (float)bezier_basis0._2800_4_ * fVar110 + (float)bezier_basis0._3956_4_ * fVar106 +
       auVar48._12_4_ * (float)bezier_basis0._1644_4_;
  auVar109._16_4_ =
       fVar105 * (float)bezier_basis0._492_4_ +
       (float)bezier_basis0._2804_4_ * fVar16 + (float)bezier_basis0._3960_4_ * fVar14 +
       fVar97 * (float)bezier_basis0._1648_4_;
  auVar109._20_4_ =
       fVar117 * (float)bezier_basis0._496_4_ +
       (float)bezier_basis0._2808_4_ * fVar47 + (float)bezier_basis0._3964_4_ * fVar69 +
       fVar103 * (float)bezier_basis0._1652_4_;
  auVar109._24_4_ =
       fVar119 * (float)bezier_basis0._500_4_ +
       (float)bezier_basis0._2812_4_ * fVar61 + (float)bezier_basis0._3968_4_ * fVar115 +
       fVar104 * (float)bezier_basis0._1656_4_;
  auVar109._28_4_ = auVar127._28_4_ + (float)bezier_basis0._3972_4_ + 0.0 + 0.0;
  auVar49 = vshufps_avx(_local_228,_local_228,0xaa);
  fVar95 = auVar49._0_4_;
  fVar107 = auVar49._4_4_;
  fVar111 = auVar49._8_4_;
  auVar87._0_4_ =
       fVar95 * (float)bezier_basis0._476_4_ +
       fVar83 * (float)bezier_basis0._1632_4_ +
       (float)bezier_basis0._2788_4_ * fVar64 + fVar128 * (float)bezier_basis0._3944_4_;
  auVar87._4_4_ =
       fVar107 * (float)bezier_basis0._480_4_ +
       fVar88 * (float)bezier_basis0._1636_4_ +
       (float)bezier_basis0._2792_4_ * fVar54 + fVar129 * (float)bezier_basis0._3948_4_;
  auVar87._8_4_ =
       fVar111 * (float)bezier_basis0._484_4_ +
       fVar94 * (float)bezier_basis0._1640_4_ +
       (float)bezier_basis0._2796_4_ * fVar33 + fVar130 * (float)bezier_basis0._3952_4_;
  auVar87._12_4_ =
       auVar49._12_4_ * (float)bezier_basis0._488_4_ +
       auVar25._12_4_ * (float)bezier_basis0._1644_4_ +
       (float)bezier_basis0._2800_4_ * fVar112 + fVar82 * (float)bezier_basis0._3956_4_;
  auVar87._16_4_ =
       fVar95 * (float)bezier_basis0._492_4_ +
       fVar83 * (float)bezier_basis0._1648_4_ +
       (float)bezier_basis0._2804_4_ * fVar64 + fVar128 * (float)bezier_basis0._3960_4_;
  auVar87._20_4_ =
       fVar107 * (float)bezier_basis0._496_4_ +
       fVar88 * (float)bezier_basis0._1652_4_ +
       (float)bezier_basis0._2808_4_ * fVar54 + fVar129 * (float)bezier_basis0._3964_4_;
  auVar87._24_4_ =
       fVar111 * (float)bezier_basis0._500_4_ +
       fVar94 * (float)bezier_basis0._1656_4_ +
       (float)bezier_basis0._2812_4_ * fVar33 + fVar130 * (float)bezier_basis0._3968_4_;
  auVar87._28_4_ = auVar100._28_4_ + 0.0 + 0.0 + 0.0;
  fVar114 = fVar39 + 0.0;
  fVar57 = fVar110 + fVar114;
  auVar27._0_4_ =
       fVar58 * (float)bezier_basis0._5100_4_ +
       fVar121 * (float)bezier_basis0._6256_4_ +
       (float)bezier_basis0._7412_4_ * fVar15 + fVar13 * (float)bezier_basis0._8568_4_;
  auVar27._4_4_ =
       fVar62 * (float)bezier_basis0._5104_4_ +
       fVar123 * (float)bezier_basis0._6260_4_ +
       (float)bezier_basis0._7416_4_ * fVar68 + fVar67 * (float)bezier_basis0._8572_4_;
  auVar27._8_4_ =
       fVar63 * (float)bezier_basis0._5108_4_ +
       fVar124 * (float)bezier_basis0._6264_4_ +
       (float)bezier_basis0._7420_4_ * fVar56 + fVar55 * (float)bezier_basis0._8576_4_;
  auVar27._12_4_ =
       auVar17._12_4_ * (float)bezier_basis0._5112_4_ +
       auVar30._12_4_ * (float)bezier_basis0._6268_4_ +
       (float)bezier_basis0._7424_4_ * auVar31._12_4_ + fVar39 * (float)bezier_basis0._8580_4_;
  auVar27._16_4_ =
       fVar58 * (float)bezier_basis0._5116_4_ +
       fVar121 * (float)bezier_basis0._6272_4_ +
       (float)bezier_basis0._7428_4_ * fVar15 + fVar13 * (float)bezier_basis0._8584_4_;
  auVar27._20_4_ =
       fVar62 * (float)bezier_basis0._5120_4_ +
       fVar123 * (float)bezier_basis0._6276_4_ +
       (float)bezier_basis0._7432_4_ * fVar68 + fVar67 * (float)bezier_basis0._8588_4_;
  auVar27._24_4_ =
       fVar63 * (float)bezier_basis0._5124_4_ +
       fVar124 * (float)bezier_basis0._6280_4_ +
       (float)bezier_basis0._7436_4_ * fVar56 + fVar55 * (float)bezier_basis0._8592_4_;
  auVar27._28_4_ = (float)bezier_basis0._6284_4_ + fVar57;
  auVar45._0_4_ =
       fVar105 * (float)bezier_basis0._5100_4_ +
       fVar97 * (float)bezier_basis0._6256_4_ +
       fVar16 * (float)bezier_basis0._7412_4_ + fVar14 * (float)bezier_basis0._8568_4_;
  auVar45._4_4_ =
       fVar117 * (float)bezier_basis0._5104_4_ +
       fVar103 * (float)bezier_basis0._6260_4_ +
       fVar47 * (float)bezier_basis0._7416_4_ + fVar69 * (float)bezier_basis0._8572_4_;
  auVar45._8_4_ =
       fVar119 * (float)bezier_basis0._5108_4_ +
       fVar104 * (float)bezier_basis0._6264_4_ +
       fVar61 * (float)bezier_basis0._7420_4_ + fVar115 * (float)bezier_basis0._8576_4_;
  auVar45._12_4_ =
       auVar42._12_4_ * (float)bezier_basis0._5112_4_ +
       auVar48._12_4_ * (float)bezier_basis0._6268_4_ +
       fVar110 * (float)bezier_basis0._7424_4_ + fVar106 * (float)bezier_basis0._8580_4_;
  auVar45._16_4_ =
       fVar105 * (float)bezier_basis0._5116_4_ +
       fVar97 * (float)bezier_basis0._6272_4_ +
       fVar16 * (float)bezier_basis0._7428_4_ + fVar14 * (float)bezier_basis0._8584_4_;
  auVar45._20_4_ =
       fVar117 * (float)bezier_basis0._5120_4_ +
       fVar103 * (float)bezier_basis0._6276_4_ +
       fVar47 * (float)bezier_basis0._7432_4_ + fVar69 * (float)bezier_basis0._8588_4_;
  auVar45._24_4_ =
       fVar119 * (float)bezier_basis0._5124_4_ +
       fVar104 * (float)bezier_basis0._6280_4_ +
       fVar61 * (float)bezier_basis0._7436_4_ + fVar115 * (float)bezier_basis0._8592_4_;
  auVar45._28_4_ = fVar57 + fVar114 + fVar110 + fVar106;
  auVar37._0_4_ =
       fVar95 * (float)bezier_basis0._5100_4_ +
       fVar83 * (float)bezier_basis0._6256_4_ +
       fVar128 * (float)bezier_basis0._8568_4_ + fVar64 * (float)bezier_basis0._7412_4_;
  auVar37._4_4_ =
       fVar107 * (float)bezier_basis0._5104_4_ +
       fVar88 * (float)bezier_basis0._6260_4_ +
       fVar129 * (float)bezier_basis0._8572_4_ + fVar54 * (float)bezier_basis0._7416_4_;
  auVar37._8_4_ =
       fVar111 * (float)bezier_basis0._5108_4_ +
       fVar94 * (float)bezier_basis0._6264_4_ +
       fVar130 * (float)bezier_basis0._8576_4_ + fVar33 * (float)bezier_basis0._7420_4_;
  auVar37._12_4_ =
       auVar49._12_4_ * (float)bezier_basis0._5112_4_ +
       auVar25._12_4_ * (float)bezier_basis0._6268_4_ +
       fVar82 * (float)bezier_basis0._8580_4_ + fVar112 * (float)bezier_basis0._7424_4_;
  auVar37._16_4_ =
       fVar95 * (float)bezier_basis0._5116_4_ +
       fVar83 * (float)bezier_basis0._6272_4_ +
       fVar128 * (float)bezier_basis0._8584_4_ + fVar64 * (float)bezier_basis0._7428_4_;
  auVar37._20_4_ =
       fVar107 * (float)bezier_basis0._5120_4_ +
       fVar88 * (float)bezier_basis0._6276_4_ +
       fVar129 * (float)bezier_basis0._8588_4_ + fVar54 * (float)bezier_basis0._7432_4_;
  auVar37._24_4_ =
       fVar111 * (float)bezier_basis0._5124_4_ +
       fVar94 * (float)bezier_basis0._6280_4_ +
       fVar130 * (float)bezier_basis0._8592_4_ + fVar33 * (float)bezier_basis0._7436_4_;
  auVar37._28_4_ = fVar57 + fVar114 + fVar82 + fVar112;
  auVar9 = vblendps_avx(auVar27,ZEXT832(0) << 0x20,1);
  auVar10 = vblendps_avx(auVar27,ZEXT832(0) << 0x20,0x80);
  auVar26 = ZEXT832(0) << 0x20;
  auVar27 = vblendps_avx(auVar45,auVar26,1);
  auVar96 = vblendps_avx(auVar45,auVar26,0x80);
  auVar19 = vblendps_avx(auVar37,auVar26,1);
  auVar26 = vblendps_avx(auVar37,auVar26,0x80);
  auVar12._4_4_ = auVar9._4_4_ * 0.055555556;
  auVar12._0_4_ = auVar9._0_4_ * 0.055555556;
  auVar12._8_4_ = auVar9._8_4_ * 0.055555556;
  auVar12._12_4_ = auVar9._12_4_ * 0.055555556;
  auVar12._16_4_ = auVar9._16_4_ * 0.055555556;
  auVar12._20_4_ = auVar9._20_4_ * 0.055555556;
  auVar12._24_4_ = auVar9._24_4_ * 0.055555556;
  auVar12._28_4_ = auVar9._28_4_;
  auVar20._4_4_ = auVar27._4_4_ * 0.055555556;
  auVar20._0_4_ = auVar27._0_4_ * 0.055555556;
  auVar20._8_4_ = auVar27._8_4_ * 0.055555556;
  auVar20._12_4_ = auVar27._12_4_ * 0.055555556;
  auVar20._16_4_ = auVar27._16_4_ * 0.055555556;
  auVar20._20_4_ = auVar27._20_4_ * 0.055555556;
  auVar20._24_4_ = auVar27._24_4_ * 0.055555556;
  auVar20._28_4_ = auVar27._28_4_;
  auVar81._0_4_ = auVar19._0_4_ * 0.055555556;
  auVar81._4_4_ = auVar19._4_4_ * 0.055555556;
  auVar81._8_4_ = auVar19._8_4_ * 0.055555556;
  auVar81._12_4_ = auVar19._12_4_ * 0.055555556;
  auVar81._16_4_ = auVar19._16_4_ * 0.055555556;
  auVar81._20_4_ = auVar19._20_4_ * 0.055555556;
  auVar81._24_4_ = auVar19._24_4_ * 0.055555556;
  auVar81._28_4_ = 0;
  auVar37 = vsubps_avx(auVar32,auVar12);
  auVar28._0_4_ = auVar32._0_4_ + auVar10._0_4_ * 0.055555556;
  auVar28._4_4_ = auVar32._4_4_ + auVar10._4_4_ * 0.055555556;
  auVar28._8_4_ = auVar32._8_4_ + auVar10._8_4_ * 0.055555556;
  auVar28._12_4_ = auVar32._12_4_ + auVar10._12_4_ * 0.055555556;
  auVar28._16_4_ = auVar32._16_4_ + auVar10._16_4_ * 0.055555556;
  auVar28._20_4_ = auVar32._20_4_ + auVar10._20_4_ * 0.055555556;
  auVar28._24_4_ = auVar32._24_4_ + auVar10._24_4_ * 0.055555556;
  auVar28._28_4_ = auVar32._28_4_ + auVar10._28_4_;
  auVar101._8_4_ = 0x7f800000;
  auVar101._0_8_ = 0x7f8000007f800000;
  auVar101._12_4_ = 0x7f800000;
  auVar101._16_4_ = 0x7f800000;
  auVar101._20_4_ = 0x7f800000;
  auVar101._24_4_ = 0x7f800000;
  auVar101._28_4_ = 0x7f800000;
  auVar9 = vminps_avx(auVar101,auVar32);
  auVar10 = vminps_avx(auVar37,auVar28);
  auVar19 = vminps_avx(auVar9,auVar10);
  auVar20 = vsubps_avx(auVar109,auVar20);
  auVar46._0_4_ = auVar109._0_4_ + auVar96._0_4_ * 0.055555556;
  auVar46._4_4_ = auVar109._4_4_ + auVar96._4_4_ * 0.055555556;
  auVar46._8_4_ = auVar109._8_4_ + auVar96._8_4_ * 0.055555556;
  auVar46._12_4_ = auVar109._12_4_ + auVar96._12_4_ * 0.055555556;
  auVar46._16_4_ = auVar109._16_4_ + auVar96._16_4_ * 0.055555556;
  auVar46._20_4_ = auVar109._20_4_ + auVar96._20_4_ * 0.055555556;
  auVar46._24_4_ = auVar109._24_4_ + auVar96._24_4_ * 0.055555556;
  auVar46._28_4_ = auVar109._28_4_ + auVar96._28_4_;
  auVar9 = vminps_avx(auVar101,auVar109);
  auVar10 = vminps_avx(auVar20,auVar46);
  auVar12 = vminps_avx(auVar9,auVar10);
  auVar44 = vsubps_avx(auVar87,auVar81);
  auVar102._0_4_ = auVar87._0_4_ + auVar26._0_4_ * 0.055555556;
  auVar102._4_4_ = auVar87._4_4_ + auVar26._4_4_ * 0.055555556;
  auVar102._8_4_ = auVar87._8_4_ + auVar26._8_4_ * 0.055555556;
  auVar102._12_4_ = auVar87._12_4_ + auVar26._12_4_ * 0.055555556;
  auVar102._16_4_ = auVar87._16_4_ + auVar26._16_4_ * 0.055555556;
  auVar102._20_4_ = auVar87._20_4_ + auVar26._20_4_ * 0.055555556;
  auVar102._24_4_ = auVar87._24_4_ + auVar26._24_4_ * 0.055555556;
  auVar102._28_4_ = auVar87._28_4_ + auVar26._28_4_;
  auVar9 = vminps_avx(auVar101,auVar87);
  auVar10 = vminps_avx(auVar44,auVar102);
  auVar26 = vminps_avx(auVar9,auVar10);
  auVar38._8_4_ = 0xff800000;
  auVar38._0_8_ = 0xff800000ff800000;
  auVar38._12_4_ = 0xff800000;
  auVar38._16_4_ = 0xff800000;
  auVar38._20_4_ = 0xff800000;
  auVar38._24_4_ = 0xff800000;
  auVar38._28_4_ = 0xff800000;
  auVar9 = vmaxps_avx(auVar38,auVar32);
  auVar10 = vmaxps_avx(auVar38,auVar109);
  auVar27 = vmaxps_avx(auVar38,auVar87);
  auVar96 = vmaxps_avx(auVar37,auVar28);
  auVar9 = vmaxps_avx(auVar9,auVar96);
  auVar96 = vmaxps_avx(auVar20,auVar46);
  auVar10 = vmaxps_avx(auVar10,auVar96);
  auVar96 = vmaxps_avx(auVar44,auVar102);
  auVar27 = vmaxps_avx(auVar27,auVar96);
  auVar96 = vshufps_avx(auVar35,auVar35,0xb1);
  auVar96 = vmaxps_avx(auVar35,auVar96);
  auVar35 = vshufpd_avx(auVar96,auVar96,5);
  auVar96 = vmaxps_avx(auVar96,auVar35);
  auVar31 = vmaxps_avx(auVar96._0_16_,auVar96._16_16_);
  auVar96 = vshufps_avx(auVar43,auVar43,0xb1);
  auVar96 = vmaxps_avx(auVar43,auVar96);
  auVar35 = vshufpd_avx(auVar96,auVar96,5);
  auVar96 = vmaxps_avx(auVar96,auVar35);
  auVar30 = vmaxps_avx(auVar96._0_16_,auVar96._16_16_);
  auVar30 = vunpcklps_avx(auVar31,auVar30);
  auVar96 = vshufps_avx(auVar36,auVar36,0xb1);
  auVar96 = vmaxps_avx(auVar36,auVar96);
  auVar35 = vshufpd_avx(auVar96,auVar96,5);
  auVar96 = vmaxps_avx(auVar96,auVar35);
  auVar31 = vmaxps_avx(auVar96._0_16_,auVar96._16_16_);
  auVar31 = vinsertps_avx(auVar30,auVar31,0x28);
  auVar96 = vshufps_avx(auVar79,auVar79,0xb1);
  auVar96 = vminps_avx(auVar79,auVar96);
  auVar35 = vshufpd_avx(auVar96,auVar96,5);
  auVar96 = vminps_avx(auVar96,auVar35);
  auVar30 = vminps_avx(auVar96._0_16_,auVar96._16_16_);
  auVar96 = vshufps_avx(auVar86,auVar86,0xb1);
  auVar96 = vminps_avx(auVar86,auVar96);
  auVar35 = vshufpd_avx(auVar96,auVar96,5);
  auVar96 = vminps_avx(auVar96,auVar35);
  auVar48 = vminps_avx(auVar96._0_16_,auVar96._16_16_);
  auVar48 = vunpcklps_avx(auVar30,auVar48);
  auVar96 = vshufps_avx(auVar11,auVar11,0xb1);
  auVar96 = vminps_avx(auVar11,auVar96);
  auVar35 = vshufpd_avx(auVar96,auVar96,5);
  auVar96 = vminps_avx(auVar96,auVar35);
  auVar30 = vminps_avx(auVar96._0_16_,auVar96._16_16_);
  auVar30 = vinsertps_avx(auVar48,auVar30,0x28);
  auVar96 = vshufps_avx(auVar19,auVar19,0xb1);
  auVar96 = vminps_avx(auVar19,auVar96);
  auVar19 = vshufpd_avx(auVar96,auVar96,5);
  auVar96 = vminps_avx(auVar96,auVar19);
  auVar48 = vminps_avx(auVar96._0_16_,auVar96._16_16_);
  auVar96 = vshufps_avx(auVar12,auVar12,0xb1);
  auVar96 = vminps_avx(auVar12,auVar96);
  auVar19 = vshufpd_avx(auVar96,auVar96,5);
  auVar96 = vminps_avx(auVar96,auVar19);
  auVar25 = vminps_avx(auVar96._0_16_,auVar96._16_16_);
  auVar25 = vunpcklps_avx(auVar48,auVar25);
  auVar96 = vshufps_avx(auVar26,auVar26,0xb1);
  auVar96 = vminps_avx(auVar26,auVar96);
  auVar19 = vshufpd_avx(auVar96,auVar96,5);
  auVar96 = vminps_avx(auVar96,auVar19);
  auVar48 = vminps_avx(auVar96._0_16_,auVar96._16_16_);
  auVar48 = vinsertps_avx(auVar25,auVar48,0x28);
  auVar25 = vminps_avx(auVar30,auVar48);
  auVar96 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar9 = vmaxps_avx(auVar9,auVar96);
  auVar96 = vshufpd_avx(auVar9,auVar9,5);
  auVar9 = vmaxps_avx(auVar9,auVar96);
  auVar30 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
  auVar9 = vshufps_avx(auVar10,auVar10,0xb1);
  auVar9 = vmaxps_avx(auVar10,auVar9);
  auVar10 = vshufpd_avx(auVar9,auVar9,5);
  auVar9 = vmaxps_avx(auVar9,auVar10);
  auVar48 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
  auVar48 = vunpcklps_avx(auVar30,auVar48);
  auVar9 = vshufps_avx(auVar27,auVar27,0xb1);
  auVar9 = vmaxps_avx(auVar27,auVar9);
  auVar10 = vshufpd_avx(auVar9,auVar9,5);
  auVar9 = vmaxps_avx(auVar9,auVar10);
  auVar30 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
  auVar30 = vinsertps_avx(auVar48,auVar30,0x28);
  auVar48 = vmaxps_avx(auVar31,auVar30);
  auVar30._8_4_ = 0x7fffffff;
  auVar30._0_8_ = 0x7fffffff7fffffff;
  auVar30._12_4_ = 0x7fffffff;
  auVar31 = vandps_avx(auVar25,auVar30);
  auVar30 = vandps_avx(auVar48,auVar30);
  auVar31 = vmaxps_avx(auVar31,auVar30);
  auVar30 = vmovshdup_avx(auVar31);
  auVar30 = vmaxss_avx(auVar30,auVar31);
  auVar31 = vshufpd_avx(auVar31,auVar31,1);
  auVar31 = vmaxss_avx(auVar31,auVar30);
  auVar31 = ZEXT416((uint)(auVar31._0_4_ * 4.7683716e-07));
  auVar31 = vshufps_avx(auVar31,auVar31,0);
  aVar18 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar25,auVar31);
  (__return_storage_ptr__->lower).field_0 = aVar18;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar48._0_4_ + auVar31._0_4_;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar48._4_4_ + auVar31._4_4_;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar48._8_4_ + auVar31._8_4_;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar48._12_4_ + auVar31._12_4_;
  return __return_storage_ptr__;
}

Assistant:

size_t CurveGeometry::getGeometryDataDeviceByteSize() const {
    size_t byte_size = sizeof(CurveGeometry);
    if (vertices.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3ff>);
    if (normals.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3fa>);
    if (tangents.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3ff>);
    if (dnormals.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3fa>);
    return 16 * ((byte_size + 15) / 16);
  }